

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

bool DerBase::DecodeSetOrSequenceOf<GeneralName>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<GeneralName,_std::allocator<GeneralName>_> *out)

{
  byte *pIn_00;
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  overflow_error *this;
  bool bVar7;
  undefined1 local_b8 [8];
  GeneralName t;
  size_t local_50;
  size_t cbElement;
  size_t *local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  std::vector<GeneralName,_std::allocator<GeneralName>_>::clear(out);
  t.super_ChoiceType._64_8_ = pIn;
  cbElement = (size_t)cbSize;
  local_40 = cbPrefix;
  bVar3 = DecodeSequenceOrSet(type,pIn,cbIn,cbPrefix,cbSize,local_31);
  if (bVar3) {
    sVar5 = 2;
    if (local_31[0] == false) {
      sVar5 = *local_40;
      uVar6 = *(long *)cbElement + sVar5;
      do {
        local_50 = 0;
        t.super_ChoiceType.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_ChoiceType.value.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_ChoiceType.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151828;
        t.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.super_ChoiceType.value.super_DerBase.cbData = 0;
        t.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x30000001f;
        t.super_ChoiceType.derType.type._0_1_ = Boolean;
        local_b8 = (undefined1  [8])&PTR_EncodedSize_00150130;
        if (uVar6 < sVar5) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        pIn_00 = (byte *)(t.super_ChoiceType._64_8_ + sVar5);
        bVar4 = AnyType::Decode((AnyType *)&t.super_ChoiceType.super_DerBase.cbData,pIn_00,
                                uVar6 - sVar5,&local_50);
        sVar2 = local_50;
        if (bVar4) {
          bVar1 = *pIn_00;
          t.super_ChoiceType.derType.type._0_1_ = bVar1 >> 5 & Boolean;
          t.super_ChoiceType.value.encodedValue.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(ulong)(CONCAT14(bVar1 >> 6,(uint)bVar1) & 0xff0000001f);
          std::vector<GeneralName,_std::allocator<GeneralName>_>::push_back
                    (out,(value_type *)local_b8);
          sVar5 = sVar5 + sVar2;
          bVar7 = sVar5 == *local_40 + *(long *)cbElement;
          bVar4 = !bVar7;
          bVar3 = (bool)(bVar7 | bVar3);
        }
        else {
          if (local_50 == 0) {
            *local_40 = 0;
            *(undefined8 *)cbElement = 0;
          }
          bVar3 = false;
          bVar4 = false;
        }
        local_b8 = (undefined1  [8])&PTR_EncodedSize_00150190;
        if (t.super_ChoiceType.value.super_DerBase.cbData != 0) {
          operator_delete((void *)t.super_ChoiceType.value.super_DerBase.cbData);
        }
      } while (bVar4);
      return bVar3;
    }
  }
  else {
    sVar5 = 0;
  }
  *local_40 = sVar5;
  *(undefined8 *)cbElement = 0;
  return bVar3;
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}